

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O0

bool __thiscall google::protobuf::io::Tokenizer::Next(Tokenizer *this)

{
  uint uVar1;
  int iVar2;
  ErrorCollector *pEVar3;
  bool bVar4;
  NextCommentStatus NVar5;
  TokenType TVar6;
  bool local_92;
  bool local_91;
  allocator<char> local_71;
  string local_70 [55];
  allocator<char> local_39;
  string local_38;
  Tokenizer *local_18;
  Tokenizer *this_local;
  
  local_18 = this;
  Token::operator=(&this->previous_,&this->current_);
  do {
    if (((this->read_error_ ^ 0xffU) & 1) == 0) {
LAB_003726c4:
      (this->current_).type = TYPE_END;
      std::__cxx11::string::clear();
      (this->current_).line = this->line_;
      (this->current_).column = this->column_;
      (this->current_).end_column = this->column_;
      return false;
    }
    ConsumeZeroOrMore<google::protobuf::io::(anonymous_namespace)::Whitespace>(this);
    NVar5 = TryConsumeCommentStart(this);
    switch(NVar5) {
    case LINE_COMMENT:
      ConsumeLineComment(this,(string *)0x0);
      break;
    case BLOCK_COMMENT:
      ConsumeBlockComment(this,(string *)0x0);
      break;
    case SLASH_NOT_COMMENT:
      return true;
    case NO_COMMENT:
    default:
      if ((this->read_error_ & 1U) != 0) goto LAB_003726c4;
      bVar4 = LookingAt<google::protobuf::io::(anonymous_namespace)::Unprintable>(this);
      if ((!bVar4) && (this->current_char_ != '\0')) {
        StartToken(this);
        bVar4 = TryConsumeOne<google::protobuf::io::(anonymous_namespace)::Letter>(this);
        if (bVar4) {
          ConsumeZeroOrMore<google::protobuf::io::(anonymous_namespace)::Alphanumeric>(this);
          (this->current_).type = TYPE_IDENTIFIER;
        }
        else {
          bVar4 = TryConsume(this,'0');
          if (bVar4) {
            TVar6 = ConsumeNumber(this,true,false);
            (this->current_).type = TVar6;
          }
          else {
            bVar4 = TryConsume(this,'.');
            if (bVar4) {
              bVar4 = TryConsumeOne<google::protobuf::io::(anonymous_namespace)::Digit>(this);
              if (bVar4) {
                if ((((this->previous_).type == TYPE_IDENTIFIER) &&
                    ((this->current_).line == (this->previous_).line)) &&
                   ((this->current_).column == (this->previous_).end_column)) {
                  pEVar3 = this->error_collector_;
                  uVar1 = this->line_;
                  iVar2 = this->column_;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            (local_70,"Need space between identifier and decimal point.",&local_71);
                  (*pEVar3->_vptr_ErrorCollector[2])
                            (pEVar3,(ulong)uVar1,(ulong)(iVar2 - 2),local_70);
                  std::__cxx11::string::~string(local_70);
                  std::allocator<char>::~allocator(&local_71);
                }
                TVar6 = ConsumeNumber(this,false,true);
                (this->current_).type = TVar6;
              }
              else {
                (this->current_).type = TYPE_SYMBOL;
              }
            }
            else {
              bVar4 = TryConsumeOne<google::protobuf::io::(anonymous_namespace)::Digit>(this);
              if (bVar4) {
                TVar6 = ConsumeNumber(this,false,false);
                (this->current_).type = TVar6;
              }
              else {
                bVar4 = TryConsume(this,'\"');
                if (bVar4) {
                  ConsumeString(this,'\"');
                  (this->current_).type = TYPE_STRING;
                }
                else {
                  bVar4 = TryConsume(this,'\'');
                  if (bVar4) {
                    ConsumeString(this,'\'');
                    (this->current_).type = TYPE_STRING;
                  }
                  else {
                    NextChar(this);
                    (this->current_).type = TYPE_SYMBOL;
                  }
                }
              }
            }
          }
        }
        EndToken(this);
        return true;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"Invalid control characters encountered in text.",&local_39);
      AddError(this,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      std::allocator<char>::~allocator(&local_39);
      NextChar(this);
      do {
        bVar4 = TryConsumeOne<google::protobuf::io::(anonymous_namespace)::Unprintable>(this);
        local_91 = true;
        if (!bVar4) {
          local_92 = false;
          if ((this->read_error_ & 1U) == 0) {
            local_92 = TryConsume(this,'\0');
          }
          local_91 = local_92;
        }
      } while (local_91 != false);
    }
  } while( true );
}

Assistant:

bool Tokenizer::Next() {
  previous_ = current_;

  while (!read_error_) {
    ConsumeZeroOrMore<Whitespace>();

    switch (TryConsumeCommentStart()) {
      case LINE_COMMENT:
        ConsumeLineComment(NULL);
        continue;
      case BLOCK_COMMENT:
        ConsumeBlockComment(NULL);
        continue;
      case SLASH_NOT_COMMENT:
        return true;
      case NO_COMMENT:
        break;
    }

    // Check for EOF before continuing.
    if (read_error_) break;

    if (LookingAt<Unprintable>() || current_char_ == '\0') {
      AddError("Invalid control characters encountered in text.");
      NextChar();
      // Skip more unprintable characters, too.  But, remember that '\0' is
      // also what current_char_ is set to after EOF / read error.  We have
      // to be careful not to go into an infinite loop of trying to consume
      // it, so make sure to check read_error_ explicitly before consuming
      // '\0'.
      while (TryConsumeOne<Unprintable>() ||
             (!read_error_ && TryConsume('\0'))) {
        // Ignore.
      }

    } else {
      // Reading some sort of token.
      StartToken();

      if (TryConsumeOne<Letter>()) {
        ConsumeZeroOrMore<Alphanumeric>();
        current_.type = TYPE_IDENTIFIER;
      } else if (TryConsume('0')) {
        current_.type = ConsumeNumber(true, false);
      } else if (TryConsume('.')) {
        // This could be the beginning of a floating-point number, or it could
        // just be a '.' symbol.

        if (TryConsumeOne<Digit>()) {
          // It's a floating-point number.
          if (previous_.type == TYPE_IDENTIFIER &&
              current_.line == previous_.line &&
              current_.column == previous_.end_column) {
            // We don't accept syntax like "blah.123".
            error_collector_->AddError(line_, column_ - 2,
              "Need space between identifier and decimal point.");
          }
          current_.type = ConsumeNumber(false, true);
        } else {
          current_.type = TYPE_SYMBOL;
        }
      } else if (TryConsumeOne<Digit>()) {
        current_.type = ConsumeNumber(false, false);
      } else if (TryConsume('\"')) {
        ConsumeString('\"');
        current_.type = TYPE_STRING;
      } else if (TryConsume('\'')) {
        ConsumeString('\'');
        current_.type = TYPE_STRING;
      } else {
        NextChar();
        current_.type = TYPE_SYMBOL;
      }

      EndToken();
      return true;
    }
  }

  // EOF
  current_.type = TYPE_END;
  current_.text.clear();
  current_.line = line_;
  current_.column = column_;
  current_.end_column = column_;
  return false;
}